

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

Vector<unsigned_int,_4> __thiscall
tcu::sampleTextureBorder<unsigned_int>(tcu *this,TextureFormat *format,Sampler *sampler)

{
  int i;
  TextureChannelClass TVar1;
  long lVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  Vector<unsigned_int,_4> *res;
  UVec4 UVar4;
  IVec4 IVar5;
  Vector<unsigned_int,_4> VVar6;
  tcu local_28 [16];
  
  TVar1 = getTextureChannelClass(format->type);
  switch(TVar1) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    getTextureBorderColorFloat(local_28,format,sampler);
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    lVar2 = 0;
    do {
      *(int *)(this + lVar2 * 4) = (int)(long)*(float *)(local_28 + lVar2 * 4);
      lVar2 = lVar2 + 1;
      uVar3 = extraout_RDX_00;
    } while (lVar2 != 4);
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    IVar5 = getTextureBorderColorInt(this,format,sampler);
    uVar3 = IVar5.m_data._8_8_;
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    UVar4 = getTextureBorderColorUint(this,format,sampler);
    uVar3 = UVar4.m_data._8_8_;
    break;
  default:
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    uVar3 = extraout_RDX;
  }
  VVar6.m_data[2] = (int)uVar3;
  VVar6.m_data[3] = (int)((ulong)uVar3 >> 0x20);
  VVar6.m_data._0_8_ = this;
  return (Vector<unsigned_int,_4>)VVar6.m_data;
}

Assistant:

tcu::Vector<ScalarType, 4> sampleTextureBorder (const TextureFormat& format, const Sampler& sampler)
{
	const tcu::TextureChannelClass channelClass = getTextureChannelClass(format.type);

	switch (channelClass)
	{
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			return getTextureBorderColorFloat(format, sampler).cast<ScalarType>();

		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			return getTextureBorderColorInt(format, sampler).cast<ScalarType>();

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			return getTextureBorderColorUint(format, sampler).cast<ScalarType>();

		default:
			DE_ASSERT(false);
			return tcu::Vector<ScalarType, 4>();
	}
}